

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_string_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableStringOneofFieldGenerator::GenerateParsingCode
          (ImmutableStringOneofFieldGenerator *this,Printer *printer)

{
  long lVar1;
  char *text;
  
  lVar1 = *(long *)((this->super_ImmutableStringFieldGenerator).descriptor_ + 0x30);
  if (*(int *)(lVar1 + 0x8c) == 3) {
    text = 
    "java.lang.String s = input.readStringRequireUtf8();\n$set_oneof_case_message$;\n$oneof_name$_ = s;\n"
    ;
  }
  else {
    text = 
    "com.google.protobuf.ByteString bs = input.readBytes();\n$set_oneof_case_message$;\n$oneof_name$_ = bs;\n"
    ;
    if (*(char *)(*(long *)(lVar1 + 0xa0) + 0xa2) != '\0') {
      text = 
      "java.lang.String s = input.readStringRequireUtf8();\n$set_oneof_case_message$;\n$oneof_name$_ = s;\n"
      ;
    }
  }
  io::Printer::Print(printer,&(this->super_ImmutableStringFieldGenerator).variables_,text);
  return;
}

Assistant:

void ImmutableStringOneofFieldGenerator::
GenerateParsingCode(io::Printer* printer) const {
  if (CheckUtf8(descriptor_)) {
    printer->Print(variables_,
      "java.lang.String s = input.readStringRequireUtf8();\n"
      "$set_oneof_case_message$;\n"
      "$oneof_name$_ = s;\n");
  } else {
    printer->Print(variables_,
      "com.google.protobuf.ByteString bs = input.readBytes();\n"
      "$set_oneof_case_message$;\n"
      "$oneof_name$_ = bs;\n");
  }
}